

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump_kconfig.cpp
# Opt level: O2

void KConfigExport::dump_source(MetaConfiguration *conf,string *filename)

{
  MetaClass *top;
  ostream *poVar1;
  string local_280;
  path local_260;
  path path;
  ofstream source;
  
  std::ofstream::ofstream(&source,(string *)filename,_S_out);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&path,filename,auto_format);
  poVar1 = std::operator<<((ostream *)&source,"// clang-format off");
  std::endl<char,std::char_traits<char>>(poVar1);
  dump_notice(&source);
  poVar1 = std::operator<<((ostream *)&source,"#include \"");
  std::filesystem::__cxx11::path::stem(&local_260,&path);
  std::filesystem::__cxx11::path::generic_string(&local_280,&local_260);
  poVar1 = std::operator<<(poVar1,(string *)&local_280);
  poVar1 = std::operator<<(poVar1,".h\"");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_280);
  std::filesystem::__cxx11::path::~path(&local_260);
  poVar1 = std::operator<<((ostream *)&source,"#include <KConfig>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&source,"#include <KConfigGroup>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&source,"#include <KSharedConfig>");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>((ostream *)&source);
  if ((conf->conf_namespace)._M_string_length != 0) {
    poVar1 = std::operator<<((ostream *)&source,"namespace ");
    poVar1 = std::operator<<(poVar1,(string *)&conf->conf_namespace);
    poVar1 = std::operator<<(poVar1," {");
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  top = (conf->top_level_class).super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (top != (MetaClass *)0x0) {
    anon_unknown.dwarf_5a11f::dump_source_class(top,&source);
  }
  if ((conf->conf_namespace)._M_string_length != 0) {
    poVar1 = std::operator<<((ostream *)&source,"}");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&source);
  poVar1 = std::operator<<((ostream *)&source,"// clang-format on");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::filesystem::__cxx11::path::~path(&path);
  std::ofstream::~ofstream(&source);
  return;
}

Assistant:

void dump_source(const MetaConfiguration &conf, const std::string &filename)
{
  std::ofstream source(filename);
  std::filesystem::path path(filename);

  source << "// clang-format off" << std::endl;

  dump_notice(source);

  source << "#include \"" << path.stem().generic_string() << ".h\""
         << std::endl;
  source << "#include <KConfig>" << std::endl;
  source << "#include <KConfigGroup>" << std::endl;
  source << "#include <KSharedConfig>" << std::endl;

  source << std::endl;

  if (conf.conf_namespace.size()) {
    source << "namespace " << conf.conf_namespace << " {" << std::endl
           << std::endl;
  }

  if (conf.top_level_class) {
    dump_source_class(conf.top_level_class.get(), source);
  }

  if (conf.conf_namespace.size()) {
    source << "}" << std::endl;
  }

  source << std::endl;
  source << "// clang-format on" << std::endl;

}